

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::MembraneHook::wrap(MembraneHook *this,ClientHook *cap,MembranePolicy *policy,bool reverse)

{
  RawBrandedSchema *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  Entry *pEVar5;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ClientHook *extraout_RDX_04;
  ClientHook *extraout_RDX_05;
  ClientHook *extraout_RDX_06;
  ClientHook *extraout_RDX_07;
  ClientHook *pCVar6;
  ClientHook *extraout_RDX_08;
  ClientHook *extraout_RDX_09;
  ClientHook *extraout_RDX_10;
  ClientHook *extraout_RDX_11;
  Table<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Callbacks>_>
  *table;
  Own<capnp::ClientHook,_std::nullptr_t> OVar7;
  undefined8 local_a8;
  long *plStack_a0;
  _func_int **local_98;
  long *local_90;
  _func_int **local_88;
  long *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  long *plStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  long *plStack_60;
  ClientHook *local_58;
  long *local_50;
  ClientHook *local_48;
  long *local_40;
  anon_class_8_1_ba1d3b32_conflict local_38;
  long *plVar3;
  
  if ((undefined1 *)cap->brand == &capnp::(anonymous_namespace)::DUMMY) {
    iVar2 = (*policy->_vptr_MembranePolicy[8])(policy);
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    plVar4 = (long *)(**(code **)(*cap[3].brand + 0x40))();
    if ((plVar4 == plVar3) && ((bool)*(char *)&cap[4]._vptr_ClientHook == !reverse)) {
      (**(code **)(*cap[2].brand + 0x20))(&local_a8);
      if (reverse) {
        local_48 = local_a8;
        local_40 = plStack_a0;
        (**(code **)(*plVar3 + 0x48))(&local_88,plVar3,&local_48,cap[3].brand,policy);
        pCVar6 = extraout_RDX;
      }
      else {
        local_58 = local_a8;
        local_50 = plStack_a0;
        (**(code **)(*plVar3 + 0x50))(&local_88,plVar3,&local_58,cap[3].brand,policy);
        pCVar6 = extraout_RDX_08;
      }
      plVar3 = local_50;
      (this->super_ClientHook)._vptr_ClientHook = local_88;
      (this->super_ClientHook).brand = local_80;
      local_80 = (long *)0x0;
      if (!reverse) {
        if (local_50 != (long *)0x0) {
          local_50 = (long *)0x0;
          (**local_58->_vptr_ClientHook)(local_58,(long)plVar3 + *(long *)(*plVar3 + -0x10));
          pCVar6 = extraout_RDX_09;
        }
        if (!reverse) goto LAB_003255e0;
      }
      plVar3 = local_80;
      if (local_80 != (long *)0x0) {
        local_80 = (long *)0x0;
        (**(code **)*local_88)(local_88,(long)plVar3 + *(long *)(*plVar3 + -0x10));
        pCVar6 = extraout_RDX_10;
      }
      plVar3 = local_40;
      if ((reverse) && (local_40 != (long *)0x0)) {
        local_40 = (long *)0x0;
        (**local_48->_vptr_ClientHook)(local_48,(long)plVar3 + *(long *)(*plVar3 + -0x10));
        pCVar6 = extraout_RDX_11;
      }
      goto LAB_003255e0;
    }
  }
  table = &(policy->wrappers).table;
  if (reverse) {
    table = &(policy->reverseWrappers).table;
  }
  local_a8 = cap;
  local_38.cap = cap;
  pEVar5 = kj::
           Table<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry,kj::HashIndex<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Callbacks>>
           ::
           FindOrCreateImpl<capnp::MembraneHook::wrap(capnp::ClientHook&,capnp::MembranePolicy&,bool)::{lambda()#1},capnp::ClientHook*&>
           ::apply<0ul>(table,(ClientHook **)&local_a8,&local_38);
  pRVar1 = (pEVar5->value).super_Schema.raw;
  if (pRVar1 != (RawBrandedSchema *)0x0) {
    (*(code *)pRVar1->generic->membersByName)(this);
    pCVar6 = extraout_RDX_00;
    goto LAB_003255e0;
  }
  if (reverse) {
    (*cap->_vptr_ClientHook[4])(&local_a8,cap);
    local_68 = (undefined4)local_a8;
    uStack_64 = local_a8._4_4_;
    plStack_60 = plStack_a0;
    plStack_a0 = (long *)0x0;
    (*policy->_vptr_MembranePolicy[6])(&local_98,policy);
    pCVar6 = extraout_RDX_01;
  }
  else {
    (*cap->_vptr_ClientHook[4])(&local_a8,cap);
    local_78 = (undefined4)local_a8;
    uStack_74 = local_a8._4_4_;
    plStack_70 = plStack_a0;
    plStack_a0 = (long *)0x0;
    (*policy->_vptr_MembranePolicy[7])(&local_98,policy);
    pCVar6 = extraout_RDX_02;
  }
  plVar3 = plStack_70;
  (this->super_ClientHook)._vptr_ClientHook = local_98;
  (this->super_ClientHook).brand = local_90;
  local_90 = (long *)0x0;
  if (reverse) {
LAB_00325562:
    plVar3 = local_90;
    if (local_90 != (long *)0x0) {
      local_90 = (long *)0x0;
      (**(code **)*local_98)(local_98,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pCVar6 = extraout_RDX_05;
    }
    plVar3 = plStack_60;
    if (reverse) {
      if (plStack_60 != (long *)0x0) {
        plStack_60 = (long *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_64,local_68))
                  ((undefined8 *)CONCAT44(uStack_64,local_68),
                   (long)plVar3 + *(long *)(*plVar3 + -0x10));
        pCVar6 = extraout_RDX_06;
      }
      plVar3 = plStack_a0;
      if ((reverse) && (plStack_a0 != (long *)0x0)) {
        plStack_a0 = (long *)0x0;
        (**local_a8->_vptr_ClientHook)(local_a8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
        pCVar6 = extraout_RDX_07;
      }
    }
  }
  else {
    if (plStack_70 != (long *)0x0) {
      plStack_70 = (long *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_74,local_78))
                ((undefined8 *)CONCAT44(uStack_74,local_78),
                 (long)plVar3 + *(long *)(*plVar3 + -0x10));
      pCVar6 = extraout_RDX_03;
    }
    plVar3 = plStack_a0;
    if (reverse) goto LAB_00325562;
    if (plStack_a0 != (long *)0x0) {
      plStack_a0 = (long *)0x0;
      (**local_a8->_vptr_ClientHook)(local_a8,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pCVar6 = extraout_RDX_04;
    }
    if (reverse) goto LAB_00325562;
  }
  (pEVar5->value).super_Schema.raw = (RawBrandedSchema *)(this->super_ClientHook).brand;
LAB_003255e0:
  OVar7.ptr = pCVar6;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

static kj::Own<ClientHook> wrap(ClientHook& cap, MembranePolicy& policy, bool reverse) {
    if (cap.isBrand(MEMBRANE_BRAND)) {
      auto& otherMembrane = kj::downcast<MembraneHook>(cap);
      auto& rootPolicy = policy.rootPolicy();
      if (&otherMembrane.policy->rootPolicy() == &rootPolicy &&
          otherMembrane.reverse == !reverse) {
        // Capability that passed across the membrane one way is now passing back the other way.
        // Unwrap it rather than double-wrap it.
        Capability::Client unwrapped(otherMembrane.inner->addRef());
        return ClientHook::from(
            reverse ? rootPolicy.importInternal(kj::mv(unwrapped), *otherMembrane.policy, policy)
                    : rootPolicy.exportExternal(kj::mv(unwrapped), *otherMembrane.policy, policy));
      }
    }

    auto& map = reverse ? policy.reverseWrappers : policy.wrappers;
    ClientHook*& slot = map.findOrCreate(&cap, [&]() -> kj::Decay<decltype(map)>::Entry {
      return { &cap, nullptr };
    });
    if (slot == nullptr) {
      auto result = ClientHook::from(
          reverse ? policy.importExternal(Capability::Client(cap.addRef()))
                  : policy.exportInternal(Capability::Client(cap.addRef())));
      slot = result;
      return result;
    } else {
      return slot->addRef();
    }
  }